

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Bytes __thiscall Omega_h::each_leq_to<long>(Omega_h *this,Read<long> *a,long b)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  LO n;
  size_t sVar2;
  Bytes BVar3;
  Write<signed_char> c;
  type_conflict1 f;
  allocator local_69;
  Write<signed_char> local_68;
  type_conflict1 local_58;
  Write<signed_char> local_30;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_58,"",&local_69);
  Write<signed_char>::Write(&local_68,(LO)(sVar2 >> 3),(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Write<signed_char>::Write(&local_58.c,&local_68);
  Write<long>::Write((Write<int> *)&local_58.a,(Write<int> *)a);
  if (((ulong)local_68.shared_alloc_.alloc & 1) == 0) {
    n = (LO)(local_68.shared_alloc_.alloc)->size;
  }
  else {
    n = (LO)((ulong)local_68.shared_alloc_.alloc >> 3);
  }
  local_58.b = b;
  parallel_for<Omega_h::each_leq_to<long>(Omega_h::Read<long>,long)::_lambda(int)_1_>
            (n,&local_58,"each_leq_to");
  Write<signed_char>::Write(&local_30,&local_68);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_30);
  Write<signed_char>::~Write(&local_30);
  each_leq_to<long>(Omega_h::Read<long>,long)::{lambda(int)#1}::~Read((_lambda_int__1_ *)&local_58);
  Write<signed_char>::~Write(&local_68);
  BVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  BVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar3.write_.shared_alloc_;
}

Assistant:

Bytes each_leq_to(Read<T> a, T b) {
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] <= b); };
  parallel_for(c.size(), f, "each_leq_to");
  return c;
}